

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc,string *config)

{
  string *__s;
  string local_b8 [39];
  allocator<char> local_91;
  undefined1 local_90 [8];
  string loc;
  char local_51;
  string local_50;
  undefined1 local_29;
  string *local_28;
  string *config_local;
  char *pkgloc_local;
  cmOSXBundleGenerator *this_local;
  string *macdir;
  
  local_29 = 0;
  local_28 = config;
  config_local = (string *)pkgloc;
  pkgloc_local = (char *)this;
  this_local = (cmOSXBundleGenerator *)__return_storage_ptr__;
  cmGeneratorTarget::GetMacContentDirectory(&local_50,this->GT,config,RuntimeBinaryArtifact);
  local_51 = '/';
  cmStrCat<std::__cxx11::string,char,char_const*&>
            (__return_storage_ptr__,&local_50,&local_51,(char **)&config_local);
  std::__cxx11::string::~string((string *)&local_50);
  register0x00000000 = cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  __s = config_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,(char *)__s,&local_91);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::find((char)local_90,0x2f);
  std::__cxx11::string::substr((ulong)local_b8,(ulong)local_90);
  std::__cxx11::string::operator=((string *)local_90,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this->MacContentFolders,(value_type *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOSXBundleGenerator::InitMacOSXContentDirectory(
  const char* pkgloc, const std::string& config)
{
  // Construct the full path to the content subdirectory.

  std::string macdir = cmStrCat(this->GT->GetMacContentDirectory(
                                  config, cmStateEnums::RuntimeBinaryArtifact),
                                '/', pkgloc);
  cmSystemTools::MakeDirectory(macdir);

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
    std::string loc = pkgloc;
    loc = loc.substr(0, loc.find('/'));
    this->MacContentFolders->insert(loc);
  }

  return macdir;
}